

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProxy::IfcProxy(IfcProxy *this)

{
  IfcProxy *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x158,"IfcProxy");
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__00efd0c0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProxy,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProxy,_2UL> *)
             &(this->super_IfcProduct).field_0x100,&PTR_construction_vtable_24__00efd170);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0xefcfe0;
  *(undefined8 *)&this->field_0x158 = 0xefd0a8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0xefd008;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xefd030;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0xefd058;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0xefd080;
  std::__cxx11::string::string((string *)&(this->super_IfcProduct).field_0x110);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Tag);
  return;
}

Assistant:

IfcProxy() : Object("IfcProxy") {}